

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O1

PSymbol * __thiscall ZCCCompiler::CompileNode(ZCCCompiler *this,ZCC_NamedNode *node)

{
  ZCC_TreeNode *pZVar1;
  PSymbolConst *pPVar2;
  
  if (node == (ZCC_NamedNode *)0x0) {
    __assert_fail("node != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                  ,0x211,"PSymbol *ZCCCompiler::CompileNode(ZCC_NamedNode *)");
  }
  if ((node->super_ZCC_TreeNode).NodeType == AST_ConstantDef) {
    pZVar1 = node[1].super_ZCC_TreeNode.SiblingPrev;
    if (pZVar1 == (ZCC_TreeNode *)0x0) {
      pPVar2 = CompileConstant(this,(ZCC_ConstantDef *)node);
      return &pPVar2->super_PSymbol;
    }
    if (pZVar1 != (ZCC_TreeNode *)0x1) {
      __assert_fail("sym == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                    ,0x21e,"PSymbol *ZCCCompiler::CompileNode(ZCC_NamedNode *)");
    }
    Error(this,&node->super_ZCC_TreeNode,"Definition of \'%s\' is infinitely recursive",
          FName::NameData.NameArray[(int)node->NodeName].Text);
  }
  return (PSymbol *)0x0;
}

Assistant:

PSymbol *ZCCCompiler::CompileNode(ZCC_NamedNode *node)
{
	assert(node != NULL);
	if (node->NodeType == AST_ConstantDef)
	{
		ZCC_ConstantDef *def = static_cast<ZCC_ConstantDef *>(node);
		PSymbolConst *sym = def->Symbol;

		if (sym == DEFINING_CONST)
		{
			Error(node, "Definition of '%s' is infinitely recursive", FName(node->NodeName).GetChars());
			sym = NULL;
		}
		else
		{
			assert(sym == NULL);
			sym = CompileConstant(def);
		}
		return sym;
	}
	else if (node->NodeType == AST_Struct)
	{

	}
	return NULL;
}